

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall
llvm::yaml::Scanner::findBlockScalarIndent
          (Scanner *this,uint *BlockIndent,uint BlockExitIndent,uint *LineBreaks,bool *IsDone)

{
  bool bVar1;
  iterator pcVar2;
  Twine local_70;
  code *local_58;
  undefined8 local_50;
  iterator local_48;
  iterator LongestAllSpaceLine;
  bool *pbStack_38;
  uint MaxAllSpaceLineCharacters;
  bool *IsDone_local;
  uint *LineBreaks_local;
  uint *puStack_20;
  uint BlockExitIndent_local;
  uint *BlockIndent_local;
  Scanner *this_local;
  
  LongestAllSpaceLine._4_4_ = 0;
  pbStack_38 = IsDone;
  IsDone_local = (bool *)LineBreaks;
  LineBreaks_local._4_4_ = BlockExitIndent;
  puStack_20 = BlockIndent;
  BlockIndent_local = (uint *)this;
  while( true ) {
    local_58 = skip_s_space;
    local_50 = 0;
    advanceWhile(this,0x28ded0);
    pcVar2 = skip_nb_char(this,this->Current);
    if (pcVar2 != this->Current) {
      if (LineBreaks_local._4_4_ < this->Column) {
        *puStack_20 = this->Column;
        if (*puStack_20 < LongestAllSpaceLine._4_4_) {
          Twine::Twine(&local_70,"Leading all-spaces line must be smaller than the block indent");
          setError(this,&local_70,local_48);
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        *pbStack_38 = true;
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    pcVar2 = skip_b_break(this,this->Current);
    if ((pcVar2 != this->Current) && (LongestAllSpaceLine._4_4_ < this->Column)) {
      LongestAllSpaceLine._4_4_ = this->Column;
      local_48 = this->Current;
    }
    if (this->Current == this->End) break;
    bVar1 = consumeLineBreakIfPresent(this);
    if (!bVar1) {
      *pbStack_38 = true;
      return true;
    }
    *(int *)IsDone_local = *(int *)IsDone_local + 1;
  }
  *pbStack_38 = true;
  return true;
}

Assistant:

bool Scanner::findBlockScalarIndent(unsigned &BlockIndent,
                                    unsigned BlockExitIndent,
                                    unsigned &LineBreaks, bool &IsDone) {
  unsigned MaxAllSpaceLineCharacters = 0;
  StringRef::iterator LongestAllSpaceLine;

  while (true) {
    advanceWhile(&Scanner::skip_s_space);
    if (skip_nb_char(Current) != Current) {
      // This line isn't empty, so try and find the indentation.
      if (Column <= BlockExitIndent) { // End of the block literal.
        IsDone = true;
        return true;
      }
      // We found the block's indentation.
      BlockIndent = Column;
      if (MaxAllSpaceLineCharacters > BlockIndent) {
        setError(
            "Leading all-spaces line must be smaller than the block indent",
            LongestAllSpaceLine);
        return false;
      }
      return true;
    }
    if (skip_b_break(Current) != Current &&
        Column > MaxAllSpaceLineCharacters) {
      // Record the longest all-space line in case it's longer than the
      // discovered block indent.
      MaxAllSpaceLineCharacters = Column;
      LongestAllSpaceLine = Current;
    }

    // Check for EOF.
    if (Current == End) {
      IsDone = true;
      return true;
    }

    if (!consumeLineBreakIfPresent()) {
      IsDone = true;
      return true;
    }
    ++LineBreaks;
  }
  return true;
}